

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler3>>
::
ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler3>>::AlgebraicConHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler3>>
           *this)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  BinaryReader<mp::internal::EndiannessConverter> *this_00;
  int iVar4;
  ComplInfo local_4c;
  ulong local_48 [2];
  ArgList local_38;
  
  iVar4 = *(int *)(*(long *)(this + 8) + 4);
  if (0 < iVar4) {
    do {
      this_00 = *(BinaryReader<mp::internal::EndiannessConverter> **)this;
      pcVar1 = (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (this_00->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar1;
      (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar1 + 1;
      switch(*pcVar1) {
      case '0':
        BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
        this_00 = *(BinaryReader<mp::internal::EndiannessConverter> **)this;
      case '1':
      case '2':
      case '4':
        BinaryReader<mp::internal::EndiannessConverter>::ReadDouble(this_00);
        break;
      case '3':
        break;
      case '5':
        uVar2 = BinaryReader<mp::internal::EndiannessConverter>::ReadInt<int>(this_00);
        uVar3 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                          (*(BinaryReader<mp::internal::EndiannessConverter> **)this);
        if ((uVar3 == 0) || (**(int **)(this + 8) < (int)uVar3)) {
          local_48[0] = (ulong)uVar3;
          local_38.field_1.values_ = (Value *)local_48;
          local_38.types_ = 2;
          BinaryReaderBase::ReportError(*(BinaryReaderBase **)this,(CStringRef)0x26c0a7,&local_38);
        }
        ComplInfo::ComplInfo(&local_4c,uVar2 & 3);
        break;
      default:
        local_38.field_1.values_ = (Value *)local_48;
        local_48[0] = 0;
        local_48[1] = 0;
        local_38.types_ = 0;
        BinaryReaderBase::ReportError
                  (&this_00->super_BinaryReaderBase,(CStringRef)0x2656a6,&local_38);
      }
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return;
}

Assistant:

int num_items() const { return this->reader_.header_.num_algebraic_cons; }